

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void * __thiscall
google::protobuf::anon_unknown_1::TableArena::AllocRawInternal
          (TableArena *this,uint32_t size,Tag tag)

{
  bool bVar1;
  uint32_t uVar2;
  size_t sVar3;
  size_type sVar4;
  reference ppBVar5;
  byte *pbVar6;
  Block *this_00;
  LogMessage *pLVar7;
  reference pvVar8;
  void *pvVar9;
  uint uVar10;
  void *p;
  size_t local_d0;
  LogFinisher local_c2;
  byte local_c1;
  LogMessage local_c0;
  undefined8 local_88;
  size_t kBlockSize;
  size_t i;
  Block *to_use;
  Block *to_relocate;
  byte local_51;
  LogMessage local_50;
  Tag local_15;
  uint32_t local_14;
  Tag tag_local;
  TableArena *pTStack_10;
  uint32_t size_local;
  TableArena *this_local;
  
  local_51 = 0;
  local_15 = tag;
  local_14 = size;
  pTStack_10 = this;
  if (size == 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x330);
    local_51 = 1;
    pLVar7 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (size) > (0): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&to_relocate + 3),pLVar7);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  sVar3 = RoundUp((ulong)local_14);
  local_14 = (uint32_t)sVar3;
  to_use = (Block *)0x0;
  i = 0;
  kBlockSize = 0;
  do {
    sVar3 = kBlockSize;
    sVar4 = std::array<unsigned_char,_6UL>::size
                      ((array<unsigned_char,_6UL> *)&(anonymous_namespace)::TableArena::kSmallSizes)
    ;
    if (sVar4 <= sVar3) {
LAB_0066f5ca:
      if (to_use == (Block *)0x0) {
        if ((this->current_ == (Block *)0x0) ||
           (uVar10 = local_14 + 1, uVar2 = Block::space_left(this->current_), uVar2 < uVar10)) {
          to_use = this->current_;
          local_88 = 0x1000;
          this_00 = (Block *)operator_new(0x1000);
          Block::Block(this_00,0x1000);
          this->current_ = this_00;
          i = (size_t)this_00;
          uVar2 = Block::space_left(this->current_);
          local_c1 = 0;
          if (uVar2 < local_14 + 1) {
            internal::LogMessage::LogMessage
                      (&local_c0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x349);
            local_c1 = 1;
            pLVar7 = internal::LogMessage::operator<<
                               (&local_c0,"CHECK failed: (current_->space_left()) >= (size + 1): ");
            internal::LogFinisher::operator=(&local_c2,pLVar7);
          }
          if ((local_c1 & 1) != 0) {
            internal::LogMessage::~LogMessage(&local_c0);
          }
        }
        else {
          i = (size_t)this->current_;
        }
      }
      this->num_allocations_ = this->num_allocations_ + 1;
      bVar1 = std::
              vector<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
              ::empty(&this->rollback_info_);
      if ((bVar1) ||
         (pvVar8 = std::
                   vector<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
                   ::back(&this->rollback_info_), pvVar8->block != (Block *)i)) {
        p = (void *)i;
        local_d0 = 1;
        std::
        vector<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
        ::push_back(&this->rollback_info_,(value_type *)&p);
      }
      else {
        pvVar8 = std::
                 vector<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
                 ::back(&this->rollback_info_);
        pvVar8->count = pvVar8->count + 1;
      }
      pvVar9 = Block::Allocate((Block *)i,local_14,local_15);
      if (to_use != (Block *)0x0) {
        RelocateToUsedList(this,to_use);
      }
      return pvVar9;
    }
    ppBVar5 = std::array<google::protobuf::(anonymous_namespace)::TableArena::Block_*,_6UL>::
              operator[](&this->small_size_blocks_,kBlockSize);
    uVar2 = local_14;
    if ((*ppBVar5 != (value_type)0x0) &&
       (pbVar6 = std::array<unsigned_char,_6UL>::operator[]
                           ((array<unsigned_char,_6UL> *)
                            &(anonymous_namespace)::TableArena::kSmallSizes,kBlockSize),
       uVar2 <= *pbVar6)) {
      ppBVar5 = std::array<google::protobuf::(anonymous_namespace)::TableArena::Block_*,_6UL>::
                operator[](&this->small_size_blocks_,kBlockSize);
      i = (size_t)PopBlock(this,ppBVar5);
      to_use = (Block *)i;
      goto LAB_0066f5ca;
    }
    kBlockSize = kBlockSize + 1;
  } while( true );
}

Assistant:

void* AllocRawInternal(uint32_t size, Tag tag) {
    GOOGLE_DCHECK_GT(size, 0);
    size = RoundUp(size);

    Block* to_relocate = nullptr;
    Block* to_use = nullptr;

    for (size_t i = 0; i < kSmallSizes.size(); ++i) {
      if (small_size_blocks_[i] != nullptr && size <= kSmallSizes[i]) {
        to_use = to_relocate = PopBlock(small_size_blocks_[i]);
        break;
      }
    }

    if (to_relocate != nullptr) {
      // We found one in the loop.
    } else if (current_ != nullptr && size + 1 <= current_->space_left()) {
      to_use = current_;
    } else {
      // No space left anywhere, make a new block.
      to_relocate = current_;
      // For now we hardcode the size to one page. Note that the maximum we can
      // allocate in the block according to the limits of Tag is less than 2k,
      // so this can fit anything that Tag can represent.
      constexpr size_t kBlockSize = 4096;
      to_use = current_ = ::new (::operator new(kBlockSize)) Block(kBlockSize);
      GOOGLE_DCHECK_GE(current_->space_left(), size + 1);
    }

    ++num_allocations_;
    if (!rollback_info_.empty() && rollback_info_.back().block == to_use) {
      ++rollback_info_.back().count;
    } else {
      rollback_info_.push_back({to_use, 1});
    }

    void* p = to_use->Allocate(size, tag);
    if (to_relocate != nullptr) {
      RelocateToUsedList(to_relocate);
    }
    return p;
  }